

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

void __thiscall cs::instance_type::dump_ast(instance_type *this,ostream *stream)

{
  bool bVar1;
  ostream *poVar2;
  _Self *__x;
  reference ppsVar3;
  ostream *in_RSI;
  any *in_RDI;
  statement_base **ptr;
  iterator __end1;
  iterator __begin1;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *__range1;
  _Self *in_stack_ffffffffffffff48;
  numeric *in_stack_ffffffffffffff58;
  any *in_stack_ffffffffffffff88;
  ostream *in_stack_ffffffffffffff90;
  _Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**> local_50;
  any *local_30;
  ostream *local_10;
  
  local_10 = in_RSI;
  poVar2 = std::operator<<(in_RSI,"< Covariant Script AST Dump >\n< BeginMetaData >\n< Version: ");
  poVar2 = std::operator<<(poVar2,(string *)(current_process + 8));
  std::operator<<(poVar2," >\n< Standard Version: ");
  cs_impl::any::any<cs::numeric>(in_RDI,in_stack_ffffffffffffff58);
  poVar2 = operator<<(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  poVar2 = std::operator<<(poVar2," >\n< Import Path: \"");
  __x = (_Self *)std::operator<<(poVar2,(string *)(current_process + 0x58));
  std::operator<<((ostream *)__x,"\" >\n");
  cs_impl::any::~any((any *)0x129bc5);
  std::operator<<(local_10,"< Platform: Unix >\n");
  std::operator<<(local_10,"< EndMetaData >\n");
  local_30 = in_RDI + 0x17;
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::begin
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             in_stack_ffffffffffffff48);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::end
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             in_stack_ffffffffffffff48);
  while( true ) {
    bVar1 = std::operator!=(__x,in_stack_ffffffffffffff48);
    if (!bVar1) break;
    ppsVar3 = std::
              _Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>::
              operator*(&local_50);
    (*(*ppsVar3)->_vptr_statement_base[5])(*ppsVar3,local_10);
    std::_Deque_iterator<cs::statement_base_*,_cs::statement_base_*&,_cs::statement_base_**>::
    operator++(__x);
  }
  std::ostream::operator<<(local_10,std::flush<char,std::char_traits<char>>);
  return;
}

Assistant:

void instance_type::dump_ast(std::ostream &stream)
	{
		stream << "< Covariant Script AST Dump >\n< BeginMetaData >\n< Version: " << current_process->version
		       << " >\n< Standard Version: "
		       << current_process->std_version
		       << " >\n< Import Path: \""
		       << current_process->import_path
		       << "\" >\n";
#ifdef COVSCRIPT_PLATFORM_WIN32
		stream << "< Platform: Win32 >\n";
#else
		stream << "< Platform: Unix >\n";
#endif
		stream << "< EndMetaData >\n";
		for (auto &ptr: statements)
			ptr->dump(stream);
		stream << std::flush;
	}